

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O3

void phmap::priv::
     AllocTest<phmap::node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>>
               (void)

{
  void *pvVar1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  s;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult AVar3;
  node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  m;
  A alloc;
  AssertHelper local_a8;
  Alloc<int> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  AssertHelper local_70;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_68;
  Alloc<int> local_18;
  
  local_18.id_ = 0;
  local_68.ctrl_ = (ctrl_t *)0x0;
  local_68.slots_ = (slot_type *)0x0;
  local_68.size_ = 0;
  local_68.capacity_ = 0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
  super__Tuple_impl<3UL,_phmap::priv::Alloc<int>_>.
  super__Head_base<3UL,_phmap::priv::Alloc<int>,_false>._M_head_impl.id_ =
       (_Head_base<3UL,_phmap::priv::Alloc<int>,_false>)(Alloc<int>)0x0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
  super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (StatefulTestingEqual)
       (StatefulTestingEqual)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (StatefulTestingHash)
       (StatefulTestingHash)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.
       super_WithId<phmap::priv::StatefulTestingHash>.id_;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  local_a0.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.super_WithId<phmap::priv::StatefulTestingHash>.
  id_ = (WithId<phmap::priv::StatefulTestingHash>)
        (WithId<phmap::priv::StatefulTestingHash>)
        ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
               next_id<phmap::priv::StatefulTestingHash>()::gId.
               super_WithId<phmap::priv::StatefulTestingHash>.id_ + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.super_WithId<phmap::priv::StatefulTestingEqual>.
  id_ = (WithId<phmap::priv::StatefulTestingEqual>)
        (WithId<phmap::priv::StatefulTestingEqual>)
        ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
               next_id<phmap::priv::StatefulTestingEqual>()::gId.
               super_WithId<phmap::priv::StatefulTestingEqual>.id_ + 1);
  AVar3 = testing::internal::CmpHelperEQ<phmap::priv::Alloc<int>,phmap::priv::Alloc<int>>
                    ((internal *)local_90,"m.get_allocator()","alloc",&local_a0,&local_18);
  s._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    s = extraout_RDX.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if ((long *)local_a0.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_a0.id_ + 8))();
      s._M_head_impl = extraout_RDX_00;
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
    s._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  local_a0.id_._0_1_ = (internal)(local_68.size_ == 0);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.size_ != 0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)&local_a0,(AssertionResult *)0x202826,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xab,(char *)CONCAT71(local_90._1_7_,local_90[0]));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    s._M_head_impl = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_90._1_7_,local_90[0]),local_80._M_allocated_capacity + 1);
      s._M_head_impl = extraout_RDX_03;
    }
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
      s._M_head_impl = extraout_RDX_04._M_head_impl;
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
      s._M_head_impl = extraout_RDX_05;
    }
  }
  keys<phmap::node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>>
            ((vector<int,_std::allocator<int>_> *)local_90,(priv *)&local_68,
             (node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
              *)s._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(&local_a0,(char *)&local_a8,(vector<int,_std::allocator<int>_> *)"keys(m)");
  pvVar1 = (void *)CONCAT71(local_90._1_7_,local_90[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_80._M_allocated_capacity - (long)pvVar1);
  }
  if (local_a0.id_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)CONCAT71(local_90._1_7_,local_90[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_90._1_7_,local_90[0]) + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::destroy_slots(&local_68);
  return;
}

Assistant:

void AllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAre());
}